

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<int,fmt::v5::basic_format_specs<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          int value,basic_format_specs<char> *spec)

{
  byte bVar1;
  int_writer<int,_fmt::v5::basic_format_specs<char>_> local_20;
  
  bVar1 = spec->type_;
  local_20.prefix_size = 0;
  if (value < 0) {
    local_20.prefix[0] = '-';
    local_20.prefix_size = 1;
    local_20.abs_value = -value;
  }
  else {
    local_20.abs_value = value;
    if ((spec->flags_ & 1) != 0) {
      local_20.prefix[0] = '+';
      if ((spec->flags_ & 2) == 0) {
        local_20.prefix[0] = ' ';
      }
      local_20.prefix_size = 1;
    }
  }
  local_20.writer =
       (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)this;
  local_20.spec = spec;
  if (bVar1 < 100) {
    if (bVar1 < 0x58) {
      if (bVar1 == 0) {
LAB_0013fad5:
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
        int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_dec(&local_20);
        return;
      }
      if (bVar1 == 0x42) {
LAB_0013fab3:
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
        int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_bin(&local_20);
        return;
      }
    }
    else {
      if (bVar1 == 0x58) {
LAB_0013fac9:
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
        int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_hex(&local_20);
        return;
      }
      if (bVar1 == 0x62) goto LAB_0013fab3;
    }
  }
  else if (bVar1 < 0x6f) {
    if (bVar1 == 100) goto LAB_0013fad5;
    if (bVar1 == 0x6e) {
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
      int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_num(&local_20);
      return;
    }
  }
  else {
    if (bVar1 == 0x6f) {
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
      int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_oct(&local_20);
      return;
    }
    if (bVar1 == 0x78) goto LAB_0013fac9;
  }
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_error(&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type(),
                                   int_writer<T, Spec>(*this, value, spec));
  }